

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::DrawIndirect(DeviceContextGLImpl *this,DrawIndirectAttribs *Attribs)

{
  bool bVar1;
  PFNGLMULTIDRAWARRAYSINDIRECTCOUNTPROC p_Var2;
  PFNGLDRAWARRAYSINDIRECTPROC p_Var3;
  PFNGLMULTIDRAWARRAYSINDIRECTPROC p_Var4;
  GLenum GVar5;
  DRAW_COMMAND_CAP_FLAGS DVar6;
  RenderDeviceGLImpl *this_00;
  GraphicsAdapterInfo *pGVar7;
  void *pvVar8;
  Char *pCVar9;
  GLvoid *pGVar10;
  long lVar11;
  GLBufferObj local_d0;
  undefined1 local_c1;
  undefined1 local_c0 [7];
  bool ResetVAO;
  undefined1 local_b1;
  undefined1 local_b0 [7];
  bool ResetVAO_1;
  string msg_2;
  undefined1 local_88 [4];
  GLenum err_2;
  string msg_1;
  unsigned_long uStack_60;
  GLenum err_1;
  Uint64 Offset;
  Uint32 draw;
  undefined1 local_48 [8];
  string msg;
  GLenum err;
  bool NativeMultiDrawExecuted;
  DrawIndirectAttribs *pDStack_18;
  GLenum GlTopology;
  DrawIndirectAttribs *Attribs_local;
  DeviceContextGLImpl *this_local;
  
  pDStack_18 = Attribs;
  Attribs_local = (DrawIndirectAttribs *)this;
  DeviceContextBase<Diligent::EngineGLImplTraits>::DrawIndirect
            (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,Attribs,0);
  PrepareForDraw(this,pDStack_18->Flags,true,&err);
  PrepareForIndirectDraw(this,pDStack_18->pAttribsBuffer);
  if (pDStack_18->pCounterBuffer == (IBuffer *)0x0) {
    bVar1 = false;
    if (1 < pDStack_18->DrawCount) {
      this_00 = RefCntAutoPtr<Diligent::RenderDeviceGLImpl>::operator->
                          (&(this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pDevice)
      ;
      pGVar7 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetAdapterInfo
                         (&this_00->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
      DVar6 = Diligent::operator&((pGVar7->DrawCommand).CapFlags,
                                  DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT);
      GVar5 = err;
      p_Var4 = __glewMultiDrawArraysIndirect;
      if (DVar6 != DRAW_COMMAND_CAP_FLAG_NONE) {
        pvVar8 = (void *)StaticCast<unsigned_long,unsigned_long>(&pDStack_18->DrawArgsOffset);
        (*p_Var4)(GVar5,pvVar8,pDStack_18->DrawCount,pDStack_18->DrawArgsStride);
        msg.field_2._12_4_ = glGetError();
        if (msg.field_2._12_4_ != 0) {
          LogError<false,char[35],char[17],unsigned_int>
                    (false,"DrawIndirect",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x4b0,(char (*) [35])"glMultiDrawArraysIndirect() failed",
                     (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 0xc));
          FormatString<char[6]>((string *)local_48,(char (*) [6])0x4585f6);
          pCVar9 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar9,"DrawIndirect",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x4b0);
          std::__cxx11::string::~string((string *)local_48);
        }
        bVar1 = true;
      }
    }
    if (!bVar1) {
      for (Offset._0_4_ = 0; GVar5 = err, p_Var3 = __glewDrawArraysIndirect,
          (uint)Offset < pDStack_18->DrawCount; Offset._0_4_ = (uint)Offset + 1) {
        uStack_60 = pDStack_18->DrawArgsOffset +
                    (ulong)(uint)Offset * (ulong)pDStack_18->DrawArgsStride;
        pvVar8 = (void *)StaticCast<unsigned_long,unsigned_long>(&stack0xffffffffffffffa0);
        (*p_Var3)(GVar5,pvVar8);
        msg_1.field_2._12_4_ = glGetError();
        if (msg_1.field_2._12_4_ != 0) {
          LogError<false,char[30],char[17],unsigned_int>
                    (false,"DrawIndirect",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x4c4,(char (*) [30])"glDrawArraysIndirect() failed",
                     (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 0xc));
          FormatString<char[6]>((string *)local_88,(char (*) [6])0x4585f6);
          pCVar9 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar9,"DrawIndirect",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                     ,0x4c4);
          std::__cxx11::string::~string((string *)local_88);
        }
      }
    }
  }
  else {
    PrepareForIndirectDrawCount(this,pDStack_18->pCounterBuffer);
    p_Var2 = __glewMultiDrawArraysIndirectCount;
    pGVar10 = (GLvoid *)StaticCast<unsigned_long,unsigned_long>(&pDStack_18->DrawArgsOffset);
    lVar11 = StaticCast<long,unsigned_long>(&pDStack_18->CounterOffset);
    (*p_Var2)(err,pGVar10,lVar11,pDStack_18->DrawCount,pDStack_18->DrawArgsStride);
    msg_2.field_2._12_4_ = glGetError();
    if (msg_2.field_2._12_4_ != 0) {
      LogError<false,char[40],char[17],unsigned_int>
                (false,"DrawIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x4d5,(char (*) [40])"glMultiDrawArraysIndirectCount() failed",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg_2.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_b0,(char (*) [6])0x4585f6);
      pCVar9 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar9,"DrawIndirect",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
                 ,0x4d5);
      std::__cxx11::string::~string((string *)local_b0);
    }
    local_b1 = 0;
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::Null();
    GLContextState::BindBuffer(&this->m_ContextState,0x80ee,(GLBufferObj *)local_c0,false);
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
              ((GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper> *)local_c0);
  }
  local_c1 = 0;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::Null();
  GLContextState::BindBuffer(&this->m_ContextState,0x8f3f,&local_d0,false);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLBufferObjCreateReleaseHelper>::~GLObjWrapper
            (&local_d0);
  PostDraw(this);
  return;
}

Assistant:

void DeviceContextGLImpl::DrawIndirect(const DrawIndirectAttribs& Attribs)
{
    TDeviceContextBase::DrawIndirect(Attribs, 0);

    GLenum GlTopology;
    PrepareForDraw(Attribs.Flags, true, GlTopology);

    // http://www.opengl.org/wiki/Vertex_Rendering
    PrepareForIndirectDraw(Attribs.pAttribsBuffer);

    if (Attribs.pCounterBuffer == nullptr)
    {
        bool NativeMultiDrawExecuted = false;
        if (Attribs.DrawCount > 1)
        {
#if GL_ARB_multi_draw_indirect
            if ((m_pDevice->GetAdapterInfo().DrawCommand.CapFlags & DRAW_COMMAND_CAP_FLAG_NATIVE_MULTI_DRAW_INDIRECT) != 0)
            {
                glMultiDrawArraysIndirect(GlTopology,
                                          reinterpret_cast<const void*>(StaticCast<size_t>(Attribs.DrawArgsOffset)),
                                          Attribs.DrawCount,
                                          Attribs.DrawArgsStride);
                DEV_CHECK_GL_ERROR("glMultiDrawArraysIndirect() failed");
                NativeMultiDrawExecuted = true;
            }
#endif
        }

        if (!NativeMultiDrawExecuted)
        {
#if GL_ARB_draw_indirect
            for (Uint32 draw = 0; draw < Attribs.DrawCount; ++draw)
            {
                Uint64 Offset = Attribs.DrawArgsOffset + draw * Uint64{Attribs.DrawArgsStride};
                //typedef  struct {
                //   GLuint  count;
                //   GLuint  instanceCount;
                //   GLuint  first;
                //   GLuint  baseInstance;
                //} DrawArraysIndirectCommand;
                glDrawArraysIndirect(GlTopology, reinterpret_cast<const void*>(StaticCast<size_t>(Offset)));
                // Note that on GLES 3.1, baseInstance is present but reserved and must be zero
                DEV_CHECK_GL_ERROR("glDrawArraysIndirect() failed");
            }
#else
            LOG_ERROR_MESSAGE("Indirect rendering is not supported");
#endif
        }
    }
    else
    {
        PrepareForIndirectDrawCount(Attribs.pCounterBuffer);

#if GL_VERSION_4_6
        glMultiDrawArraysIndirectCount(GlTopology,
                                       reinterpret_cast<const void*>(StaticCast<size_t>(Attribs.DrawArgsOffset)),
                                       StaticCast<GLintptr>(Attribs.CounterOffset),
                                       Attribs.DrawCount,
                                       Attribs.DrawArgsStride);
        DEV_CHECK_GL_ERROR("glMultiDrawArraysIndirectCount() failed");

        constexpr bool ResetVAO = false; // GL_PARAMETER_BUFFER does not affect VAO
        m_ContextState.BindBuffer(GL_PARAMETER_BUFFER, GLObjectWrappers::GLBufferObj::Null(), ResetVAO);
#else
        LOG_ERROR_MESSAGE("Multi indirect count rendering is not supported");
#endif
    }

    constexpr bool ResetVAO = false; // GL_DRAW_INDIRECT_BUFFER does not affect VAO
    m_ContextState.BindBuffer(GL_DRAW_INDIRECT_BUFFER, GLObjectWrappers::GLBufferObj::Null(), ResetVAO);

    PostDraw();
}